

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char*,std::integral_constant<bool,false>>,char>>
::int_writer<int,fmt::v5::basic_format_specs<char>>::num_writer::operator()
          (num_writer *this,truncating_iterator<char_*,_std::integral_constant<bool,_false>_> *it)

{
  int iVar1;
  ulong uVar2;
  value_type vVar3;
  value_type *pvVar4;
  long lVar5;
  int iVar6;
  value_type vVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  uint uVar11;
  value_type *pvVar12;
  byte bVar13;
  uint uVar14;
  int iVar15;
  size_t sVar16;
  ulong uVar17;
  bool bVar18;
  value_type avStack_3d [13];
  char_type buffer [13];
  
  pvVar4 = (it->super_truncating_iterator_base<char_*>).out_;
  uVar2 = (it->super_truncating_iterator_base<char_*>).limit_;
  sVar16 = (it->super_truncating_iterator_base<char_*>).count_;
  vVar7 = it->blackhole_;
  uVar11 = *(uint *)this;
  iVar1 = *(int *)(this + 4);
  pvVar12 = avStack_3d + iVar1;
  if (uVar11 < 100) {
    bVar18 = false;
  }
  else {
    iVar6 = -1;
    uVar9 = 1;
    iVar15 = -2;
    uVar17 = 2;
    do {
      uVar14 = uVar11;
      uVar10 = (ulong)((uVar14 % 100) * 2);
      pvVar12[-1] = internal::basic_data<void>::DIGITS[uVar10 + 1];
      lVar5 = -1;
      if ((int)(uVar9 / 3) * 3 + iVar6 == 0) {
        *(num_writer *)(pvVar12 + -2) = this[8];
        lVar5 = -2;
      }
      pvVar12[lVar5 + -1] = internal::basic_data<void>::DIGITS[uVar10];
      if ((int)(uVar17 / 3) * 3 + iVar15 == 0) {
        *(num_writer *)(pvVar12 + lVar5 + -2) = this[8];
        lVar5 = lVar5 + -2;
      }
      else {
        lVar5 = lVar5 + -1;
      }
      pvVar12 = pvVar12 + lVar5;
      iVar6 = iVar6 + -2;
      uVar8 = (int)uVar9 + 2;
      uVar9 = (ulong)uVar8;
      iVar15 = iVar15 + -2;
      uVar17 = (ulong)((int)uVar17 + 2);
      uVar11 = uVar14 / 100;
    } while (9999 < uVar14);
    bVar18 = iVar6 + (uVar8 / 3) * 3 == 0;
    uVar11 = uVar14 / 100;
  }
  if (uVar11 < 10) {
    bVar13 = (byte)uVar11 | 0x30;
  }
  else {
    pvVar12[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar11 * 2 & 0xffffffff) + 1];
    lVar5 = -1;
    if (bVar18) {
      *(num_writer *)(pvVar12 + -2) = this[8];
      lVar5 = -2;
    }
    pvVar12 = pvVar12 + lVar5;
    bVar13 = internal::basic_data<void>::DIGITS[(ulong)uVar11 * 2];
  }
  pvVar12[-1] = bVar13;
  if (0 < iVar1) {
    lVar5 = 0;
    do {
      vVar3 = avStack_3d[lVar5];
      if (sVar16 + lVar5 < uVar2) {
        *pvVar4 = avStack_3d[lVar5];
        vVar3 = vVar7;
      }
      vVar7 = vVar3;
      pvVar4 = pvVar4 + (sVar16 + lVar5 < uVar2);
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
    sVar16 = sVar16 + lVar5;
  }
  (it->super_truncating_iterator_base<char_*>).out_ = pvVar4;
  (it->super_truncating_iterator_base<char_*>).limit_ = uVar2;
  (it->super_truncating_iterator_base<char_*>).count_ = sVar16;
  it->blackhole_ = vVar7;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }